

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O2

void __thiscall
BlockFilter::BlockFilter
          (BlockFilter *this,BlockFilterType filter_type,CBlock *block,CBlockUndo *block_undo)

{
  uint uVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer pCVar4;
  pointer pCVar5;
  pointer pCVar6;
  pointer pCVar7;
  uint uVar8;
  invalid_argument *this_00;
  CScript *pCVar9;
  CTxUndo *tx_undo;
  pointer pCVar10;
  CTransactionRef *tx;
  pointer psVar11;
  CScript *pCVar12;
  long in_FS_OFFSET;
  ElementSet elements;
  GCSFilter local_a8;
  Params local_68;
  char *local_48;
  CScript *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_filter_type = filter_type;
  CBlockHeader::GetHash(&this->m_block_hash,&block->super_CBlockHeader);
  elements._M_h.
  super__Hashtable_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  .
  super__Hash_code_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__detail::_Identity,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
  .super__Hashtable_ebo_helper<1,_ByteVectorHash,_false>._M_tp.m_k0 = 0;
  elements._M_h.
  super__Hashtable_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  .
  super__Hash_code_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__detail::_Identity,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
  .super__Hashtable_ebo_helper<1,_ByteVectorHash,_false>._M_tp.m_k1 = 0;
  elements._M_h._M_buckets._0_1_ = 0;
  elements._M_h._M_buckets._4_4_ = 1;
  GCSFilter::GCSFilter(&this->m_filter,(Params *)&elements);
  if (this->m_filter_type == BASIC) {
    local_68.m_siphash_k0 = *(uint64_t *)(this->m_block_hash).super_base_blob<256U>.m_data._M_elems;
    local_68.m_siphash_k1 =
         *(uint64_t *)((this->m_block_hash).super_base_blob<256U>.m_data._M_elems + 8);
    local_68.m_P = '\x13';
    local_68.m_M = 0xbfa23;
    std::
    _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::_Hashtable(&elements._M_h);
    psVar2 = (block->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar11 = (block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar2;
        psVar11 = psVar11 + 1) {
      peVar3 = (psVar11->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar5 = (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pCVar4 = (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      while (pCVar12 = (CScript *)((long)pCVar4 + 8),
            (pointer)((long)(pCVar12 + -1) + 0x18U) != pCVar5) {
        uVar1 = (pCVar12->super_CScriptBase)._size;
        uVar8 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar8 = uVar1;
        }
        if (uVar8 != 0) {
          pCVar9 = pCVar12;
          if (0x1c < uVar1) {
            pCVar9 = *(CScript **)&(pCVar12->super_CScriptBase)._union;
          }
          if (*(char *)&(pCVar9->super_CScriptBase)._union != 'j') {
            local_48 = (char *)((long)&(pCVar9->super_CScriptBase)._union + (long)(int)uVar8);
            local_40 = pCVar9;
            std::
            _Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_emplace<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,prevector<28u,unsigned_char,unsigned_int,int>::const_iterator>
                      ((_Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&elements,&local_40,&local_48);
          }
        }
        pCVar4 = (pointer)(pCVar12 + 1);
      }
    }
    pCVar6 = (block_undo->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar10 = (block_undo->vtxundo).super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>.
                   _M_impl.super__Vector_impl_data._M_start; pCVar10 != pCVar6;
        pCVar10 = pCVar10 + 1) {
      pCVar7 = (pCVar10->vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar12 = &(((pCVar10->vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                        super__Vector_impl_data._M_start)->out).scriptPubKey;
          (pointer)((long)(pCVar12 + -1) + 0x18U) != pCVar7;
          pCVar12 = (CScript *)((long)(pCVar12 + 1) + 0x10)) {
        uVar1 = (pCVar12->super_CScriptBase)._size;
        uVar8 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar8 = uVar1;
        }
        if (uVar8 != 0) {
          local_40 = pCVar12;
          if (0x1c < uVar1) {
            local_40 = *(CScript **)&(pCVar12->super_CScriptBase)._union;
          }
          local_48 = (char *)((long)&(local_40->super_CScriptBase)._union + (long)(int)uVar8);
          std::
          _Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_emplace<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,prevector<28u,unsigned_char,unsigned_int,int>::const_iterator>
                    ((_Hashtable<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::__detail::_Identity,std::equal_to<std::vector<unsigned_char,std::allocator<unsigned_char>>>,ByteVectorHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&elements,&local_40,&local_48);
        }
      }
    }
    GCSFilter::GCSFilter(&local_a8,&local_68,&elements);
    GCSFilter::operator=(&this->m_filter,&local_a8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_a8.m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              );
    std::
    _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&elements._M_h);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"unknown filter_type");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  __stack_chk_fail();
}

Assistant:

BlockFilter::BlockFilter(BlockFilterType filter_type, const CBlock& block, const CBlockUndo& block_undo)
    : m_filter_type(filter_type), m_block_hash(block.GetHash())
{
    GCSFilter::Params params;
    if (!BuildParams(params)) {
        throw std::invalid_argument("unknown filter_type");
    }
    m_filter = GCSFilter(params, BasicFilterElements(block, block_undo));
}